

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

int cpu_memory_rw_debug_arm
              (CPUState *cpu,target_ulong addr,void *ptr,target_ulong len,_Bool is_write)

{
  uc_struct_conflict7 *puVar1;
  uint uVar2;
  hwaddr hVar3;
  MemTxAttrs local_b0;
  int local_ac;
  MemTxAttrs attrs;
  int asidx;
  uint8_t *buf;
  target_ulong page;
  hwaddr phys_addr;
  uc_struct_conflict1 *uc;
  _Bool is_write_local;
  void *ptr_local;
  CPUState *cpu_local;
  FlatView *fv;
  MemoryRegion *mr;
  void *ptr_1;
  hwaddr addr1;
  hwaddr l_1;
  MemTxResult result;
  
  ptr_local._4_4_ = (uint)addr;
  uc._4_4_ = (uint)len;
  puVar1 = cpu->uc;
  _attrs = ptr;
  while( true ) {
    if (uc._4_4_ == 0) {
      return 0;
    }
    uVar2 = ptr_local._4_4_ & puVar1->init_target_page->mask;
    hVar3 = cpu_get_phys_page_attrs_debug(cpu,(ulong)uVar2,&local_b0);
    local_ac = cpu_asidx_from_attrs(cpu,local_b0);
    if (hVar3 == 0xffffffffffffffff) break;
    buf._4_4_ = (uVar2 - puVar1->init_target_page->mask) - ptr_local._4_4_;
    if (uc._4_4_ < buf._4_4_) {
      buf._4_4_ = uc._4_4_;
    }
    hVar3 = (ptr_local._4_4_ & (puVar1->init_target_page->mask ^ 0xffffffffU)) + hVar3;
    if (is_write) {
      address_space_write_rom_arm(cpu->cpu_ases[local_ac].as,hVar3,local_b0,_attrs,(ulong)buf._4_4_)
      ;
    }
    else {
      address_space_read_full_arm(cpu->cpu_ases[local_ac].as,hVar3,local_b0,_attrs,(ulong)buf._4_4_)
      ;
    }
    uc._4_4_ = uc._4_4_ - buf._4_4_;
    _attrs = (void *)((long)_attrs + (ulong)buf._4_4_);
    ptr_local._4_4_ = buf._4_4_ + ptr_local._4_4_;
  }
  return -1;
}

Assistant:

int cpu_memory_rw_debug(CPUState *cpu, target_ulong addr,
                        void *ptr, target_ulong len, bool is_write)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    hwaddr phys_addr;
    target_ulong l, page;
    uint8_t *buf = ptr;

    while (len > 0) {
        int asidx;
        MemTxAttrs attrs;

        page = addr & TARGET_PAGE_MASK;
        phys_addr = cpu_get_phys_page_attrs_debug(cpu, page, &attrs);
        asidx = cpu_asidx_from_attrs(cpu, attrs);
        /* if no physical page mapped, return an error */
        if (phys_addr == -1)
            return -1;
        l = (page + TARGET_PAGE_SIZE) - addr;
        if (l > len)
            l = len;
        phys_addr += (addr & ~TARGET_PAGE_MASK);
        if (is_write) {
            address_space_write_rom(cpu->cpu_ases[asidx].as, phys_addr,
                                    attrs, buf, l);
        } else {
            address_space_read(cpu->cpu_ases[asidx].as, phys_addr, attrs, buf,
                               l);
        }
        len -= l;
        buf += l;
        addr += l;
    }
    return 0;
}